

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O1

string * cs_impl::string_cs_ext::append(string *__return_storage_ptr__,string *str,var *val)

{
  pointer pcVar1;
  string local_38;
  
  any::to_string_abi_cxx11_(&local_38,val);
  std::__cxx11::string::_M_append((char *)str,(ulong)local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + str->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

string append(string &str, const var &val)
		{
			str.append(val.to_string());
			return str;
		}